

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

Reader * capnp::_::PointerHelpers<capnp::DynamicList,_(capnp::Kind)7>::getDynamic
                   (Reader *__return_storage_ptr__,PointerReader reader,ListSchema schema)

{
  ListReader reader_00;
  ListSchema schema_00;
  ElementSize expectedElementSize;
  Which elementType;
  ListReader local_58;
  Type local_28;
  undefined1 local_18 [8];
  ListSchema schema_local;
  
  local_28.field_4 = schema.elementType.field_4;
  local_28._0_8_ = schema.elementType._0_8_;
  local_18 = (undefined1  [8])local_28._0_8_;
  schema_local.elementType._0_8_ = local_28.field_4.scopeId;
  elementType = ListSchema::whichElementType((ListSchema *)local_18);
  expectedElementSize = anon_unknown_70::elementSizeFor(elementType);
  PointerReader::getList(&local_58,&reader,expectedElementSize,(word *)0x0);
  schema_00.elementType.field_4.schema = local_28.field_4.schema;
  schema_00.elementType.baseType = local_28.baseType;
  schema_00.elementType.listDepth = local_28.listDepth;
  schema_00.elementType.isImplicitParam = local_28.isImplicitParam;
  schema_00.elementType.field_3 = local_28.field_3;
  schema_00.elementType._6_2_ = local_28._6_2_;
  reader_00.capTable = local_58.capTable;
  reader_00.segment = local_58.segment;
  reader_00.ptr = local_58.ptr;
  reader_00.elementCount = local_58.elementCount;
  reader_00.step = local_58.step;
  reader_00.structDataSize = local_58.structDataSize;
  reader_00.structPointerCount = local_58.structPointerCount;
  reader_00.elementSize = local_58.elementSize;
  reader_00._39_1_ = local_58._39_1_;
  reader_00.nestingLimit = local_58.nestingLimit;
  reader_00._44_4_ = local_58._44_4_;
  DynamicList::Reader::Reader(__return_storage_ptr__,schema_00,reader_00);
  return __return_storage_ptr__;
}

Assistant:

DynamicList::Reader PointerHelpers<DynamicList, Kind::OTHER>::getDynamic(
    PointerReader reader, ListSchema schema) {
  return DynamicList::Reader(schema,
      reader.getList(elementSizeFor(schema.whichElementType()), nullptr));
}